

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::visitStructNew(OptimizeInstructions *this,StructNew *curr)

{
  StructNew *pSVar1;
  Type this_00;
  bool bVar2;
  bool bVar3;
  Struct *pSVar4;
  pointer pFVar5;
  Expression *pEVar6;
  ulong uVar7;
  ulong uVar8;
  Literal local_78;
  anon_union_16_6_1532cd5a_for_Literal_0 local_60;
  StructNew *local_48;
  Type local_40;
  Type type;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id != 1) &&
     ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0)) {
    type.id = (uintptr_t)this;
    local_60.i64 = (int64_t)wasm::Type::getHeapType
                                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).
                                        super_Expression.type);
    pSVar4 = HeapType::getStruct((HeapType *)&local_60.func);
    if ((long)(pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_start >> 4 !=
        (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x726,"void wasm::OptimizeInstructions::visitStructNew(StructNew *)");
    }
    pFVar5 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_finish != pFVar5) {
      uVar7 = 0;
      uVar8 = 1;
      local_48 = curr;
      do {
        pSVar1 = local_48;
        local_40.id = pFVar5[uVar7].type.id;
        bVar2 = wasm::Type::isDefaultable(&local_40);
        if (!bVar2) {
          return;
        }
        if ((pSVar1->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar7) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pEVar6 = getFallthrough((OptimizeInstructions *)type.id,
                                (pSVar1->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                .data[uVar7]);
        bVar2 = Properties::isSingleConstantExpression(pEVar6);
        bVar3 = true;
        if (bVar2) {
          Properties::getLiteral((Literal *)&local_60.func,pEVar6);
          Literal::makeZero(&local_78,local_40);
          bVar3 = Literal::operator!=((Literal *)&local_60.func,&local_78);
        }
        if (bVar2) {
          Literal::~Literal(&local_78);
          Literal::~Literal((Literal *)&local_60.func);
        }
        if (bVar3 != false) {
          return;
        }
        pFVar5 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar8 < (ulong)((long)(pSVar4->fields).
                                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pFVar5 >> 4)
        ;
        uVar7 = uVar8;
        curr = local_48;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar2);
    }
    this_00.id = type.id;
    pEVar6 = wasm::getDroppedChildrenAndAppend
                       ((Expression *)curr,*(Module **)(type.id + 0x128),
                        (PassOptions *)(*(long *)(type.id + 8) + 0x30),(Expression *)curr,
                        NoticeParentEffects);
    (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    replaceCurrent((OptimizeInstructions *)this_00.id,pEVar6);
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    // If values are provided, but they are all the default, then we can remove
    // them (in reachable code).
    if (curr->type == Type::unreachable || curr->isWithDefault()) {
      return;
    }

    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());

    for (Index i = 0; i < fields.size(); i++) {
      // The field must be defaultable.
      auto type = fields[i].type;
      if (!type.isDefaultable()) {
        return;
      }

      // The field must be written the default value.
      auto* value = getFallthrough(curr->operands[i]);
      if (!Properties::isSingleConstantExpression(value) ||
          Properties::getLiteral(value) != Literal::makeZero(type)) {
        return;
      }
    }

    // Success! Drop the children and return a struct.new_with_default.
    auto* rep = getDroppedChildrenAndAppend(curr, curr);
    curr->operands.clear();
    assert(curr->isWithDefault());
    replaceCurrent(rep);
  }